

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_utils.h
# Opt level: O0

uint64_t SipHash(uint64_t k0,uint64_t k1,uint64_t data)

{
  ulong in_RDX;
  ulong in_RSI;
  ulong in_RDI;
  long in_FS_OFFSET;
  uint64_t v3;
  uint64_t v2;
  uint64_t v1;
  uint64_t v0;
  uint64_t *v2_00;
  uint64_t *v1_00;
  uint64_t *v0_00;
  ulong local_28;
  ulong local_20;
  ulong local_18;
  ulong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = in_RDI ^ 0x736f6d6570736575;
  local_18 = in_RSI ^ 0x646f72616e646f6d;
  local_20 = in_RDI ^ 0x6c7967656e657261;
  v2_00 = &local_10;
  v1_00 = &local_18;
  v0_00 = &local_20;
  SipHashRound(v0_00,v1_00,v2_00,(uint64_t *)0x1523275);
  SipHashRound(v0_00,v1_00,v2_00,(uint64_t *)0x152328d);
  local_10 = local_10 ^ in_RDX;
  local_28 = in_RSI ^ in_RDX ^ 0x7c65646279746573;
  SipHashRound(v0_00,v1_00,v2_00,(uint64_t *)0x15232c1);
  SipHashRound(v0_00,v1_00,v2_00,(uint64_t *)0x15232d9);
  local_10 = local_10 ^ 0x800000000000000;
  local_20 = CONCAT71(local_20._1_7_,~(byte)local_20);
  SipHashRound(v0_00,v1_00,v2_00,(uint64_t *)0x1523305);
  SipHashRound(v0_00,v1_00,v2_00,(uint64_t *)0x152331d);
  SipHashRound(v0_00,v1_00,v2_00,(uint64_t *)0x1523335);
  SipHashRound(v0_00,v1_00,v2_00,(uint64_t *)0x152334d);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_10 ^ local_18 ^ local_20 ^ local_28;
  }
  __stack_chk_fail();
}

Assistant:

inline uint64_t SipHash(uint64_t k0, uint64_t k1, uint64_t data) {
    uint64_t v0 = 0x736f6d6570736575ULL ^ k0;
    uint64_t v1 = 0x646f72616e646f6dULL ^ k1;
    uint64_t v2 = 0x6c7967656e657261ULL ^ k0;
    uint64_t v3 = 0x7465646279746573ULL ^ k1 ^ data;
    SipHashRound(v0, v1, v2, v3);
    SipHashRound(v0, v1, v2, v3);
    v0 ^= data;
    v3 ^= 0x800000000000000ULL;
    SipHashRound(v0, v1, v2, v3);
    SipHashRound(v0, v1, v2, v3);
    v0 ^= 0x800000000000000ULL;
    v2 ^= 0xFF;
    SipHashRound(v0, v1, v2, v3);
    SipHashRound(v0, v1, v2, v3);
    SipHashRound(v0, v1, v2, v3);
    SipHashRound(v0, v1, v2, v3);
    return v0 ^ v1 ^ v2 ^ v3;
}